

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grammar.cpp
# Opt level: O3

bool Grammar::is_identifier(string *str)

{
  bool bVar1;
  iterator iVar2;
  long lVar3;
  
  if (str->_M_string_length == 0) {
    return false;
  }
  bVar1 = str_utils::is_alpha(*(str->_M_dataplus)._M_p);
  if (bVar1) {
    if (1 < (int)str->_M_string_length) {
      lVar3 = 1;
      do {
        bVar1 = str_utils::is_alphanumeric((str->_M_dataplus)._M_p[lVar3]);
        if ((!bVar1) && ((str->_M_dataplus)._M_p[lVar3] != '_')) goto LAB_001402b9;
        lVar3 = lVar3 + 1;
      } while (lVar3 < (int)str->_M_string_length);
    }
    iVar2 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)RESERVED_WORDS_abi_cxx11_,str);
    bVar1 = iVar2._M_node == (_Base_ptr)(RESERVED_WORDS_abi_cxx11_ + 8);
  }
  else {
LAB_001402b9:
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool Grammar::is_identifier(const std::string& str) {
    if (str.size() == 0 || !str_utils::is_alpha(str[0]))
        return false;
    for (int i = 1; i < int(str.size()); i++)
        if (!str_utils::is_alphanumeric(str[i]) && str[i] != '_')
            return false;
    return !is_reserved_word(str);
}